

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O2

void __thiscall
PS2KeyboardAnalyzerResults::GenerateFrameTabularText
          (PS2KeyboardAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  PS2KeyboardAnalyzerResults *this_00;
  PS2KeyboardAnalyzerSettings *pPVar6;
  undefined8 in_stack_fffffffffffffab8;
  undefined4 uVar7;
  char codetype [32];
  char device_str [16];
  Frame frame;
  PS2KeyboardAnalyzerSettings *local_4c0;
  PS2KeyboardAnalyzer *local_4b8;
  byte local_4af;
  char key_str [64];
  char tmp_str [128];
  char num_str [128];
  char result_str [255];
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  AnalyzerResults::ClearTabularText();
  this_00 = (PS2KeyboardAnalyzerResults *)&frame;
  AnalyzerResults::GetFrame((ulonglong)this_00);
  if ((local_4af & 1) != 0) {
    device_str._4_4_ = device_str._4_4_ & 0xffffff00;
    builtin_strncpy(device_str,"Host",4);
    pPVar6 = local_4c0;
    AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,8,num_str,0x20);
    GetCommandName((PS2KeyboardAnalyzerResults *)pPVar6,tmp_str,(U64)local_4c0,
                   this->mSettings->mDeviceType);
    sprintf(result_str,"%s: %s (%s)",device_str);
    AnalyzerResults::AddTabularText
              ((char *)this,result_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_00109129;
  }
  dVar1 = this->mSettings->mDeviceType;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    builtin_strncpy(device_str,"Mouse",6);
    uVar2 = device_str._0_4_;
    device_str._0_8_ = CONCAT44(device_str._4_4_,uVar2);
    GetKeyName(this_00,result_str,(U64)local_4c0,local_4af & 8);
    if ((local_4af & 2) == 0) {
      if ((local_4af & 0x20) == 0) {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,8,key_str,0x80);
        strcpy(num_str,key_str);
        result_str._0_8_ = result_str._0_8_ & 0xffffffffffffff00;
      }
      else {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,0x20,key_str,0x80);
        strcpy(num_str,key_str);
        dVar1 = this->mSettings->mDeviceType;
        if ((dVar1 != 1.0) || (NAN(dVar1))) {
          uVar5 = (uint)((ulong)local_4c0 >> 0x1d) & 1;
          uVar3 = 0;
          pcVar4 = 
          "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
          ;
        }
        else {
          uVar3 = (uint)((ulong)local_4c0 >> 8) & 0xff;
          uVar5 = (uint)((ulong)local_4c0 >> 0x10) & 0xff;
          pcVar4 = 
          "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
          ;
        }
        sprintf(result_str,pcVar4,((ulong)local_4c0 & 0xffffffff) >> 7 & 1,
                (ulong)((byte)(((ulong)local_4c0 & 0xffffffff) >> 6) & 1),
                (ulong)((byte)(((ulong)local_4c0 & 0xffffffff) >> 5) & 1),
                (ulong)((byte)(((ulong)local_4c0 & 0xffffffff) >> 4) & 1),
                CONCAT44(uVar7,(uint)((byte)(((ulong)local_4c0 & 0xffffffff) >> 2) & 1)),
                (uint)((byte)(((ulong)local_4c0 & 0xffffffff) >> 1) & 1),(uint)((byte)local_4c0 & 1)
                ,uVar3,uVar5);
      }
    }
    else if (((ulong)local_4b8 & 1) == 0) {
      if (((ulong)local_4b8 & 4) != 0) {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,8,key_str,0x80);
        strcpy(num_str,key_str);
        builtin_strncpy(result_str,"Power-On Self Test Successfull",0x1f);
      }
    }
    else {
      AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,8,key_str,0x80);
      strcpy(num_str,key_str);
      result_str._0_8_ = result_str._0_8_ & 0xffffffffffffff00;
    }
    strcpy(key_str,num_str);
    sprintf(tmp_str,"%s: %s %s (%s)",device_str);
    AnalyzerResults::AddTabularText
              ((char *)this,tmp_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_00109129;
  }
  builtin_strncpy(device_str,"Keyboard",9);
  pPVar6 = local_4c0;
  AnalyzerHelpers::GetNumberString((ulonglong)local_4c0,Hexadecimal,8,num_str,0x20);
  GetKeyName((PS2KeyboardAnalyzerResults *)pPVar6,key_str,(U64)local_4c0,local_4af & 8);
  if ((local_4af & 2) == 0) {
    if ((char)local_4af < '\0') {
      strcpy(tmp_str,num_str);
      builtin_strncpy(key_str,"INVALID CODE",0xd);
    }
    else if (local_4af < 0x40) {
      if ((local_4af & 0x10) == 0 || local_4af < 0x20) {
        if (local_4af < 0x20) {
          if ((~local_4af & 0x18) == 0) {
            pcVar4 = "0xE0, 0xF0, %s";
LAB_00108af6:
            sprintf(tmp_str,pcVar4,num_str);
          }
          else if ((local_4af & 8) == 0) {
            if ((local_4af & 0x10) != 0) {
              pcVar4 = "0xF0, %s";
              goto LAB_00108af6;
            }
            strcpy(tmp_str,num_str);
          }
          else {
            sprintf(tmp_str,"0xE0, %s",num_str);
          }
          goto LAB_001090c9;
        }
        builtin_strncpy(tmp_str + 8,"12, 0xE0, 0x7C",0xf);
      }
      else {
        builtin_strncpy(tmp_str + 8,"F0, 0x7C, 0xE0, 0xF0, 0x12",0x1b);
      }
      builtin_strncpy(tmp_str,"0xE0, 0x",8);
      builtin_strncpy(key_str,"[PRINT SCREEN]",0xf);
    }
    else {
      builtin_strncpy(tmp_str + 0x23," 0xF0, 0x77",0xc);
      builtin_strncpy(tmp_str,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14,",0x23);
      builtin_strncpy(key_str,"[PAUSE/BREAK]",0xe);
    }
  }
  else if (((ulong)local_4b8 & 1) == 0) {
    if (((ulong)local_4b8 & 2) == 0) {
      if (((ulong)local_4b8 & 4) != 0) {
        strcpy(tmp_str,num_str);
        builtin_strncpy(key_str,"Power-On Self Test Successfull",0x1f);
      }
    }
    else {
      strcpy(tmp_str,num_str);
      key_str[0] = '\0';
    }
  }
  else {
    strcpy(tmp_str,num_str);
    key_str[0] = '\0';
  }
LAB_001090c9:
  strcpy(num_str,tmp_str);
  sprintf(result_str,"%s: %s %s (%s)",device_str);
  AnalyzerResults::AddTabularText
            ((char *)this,result_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00109129:
  Frame::~Frame(&frame);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();
    Frame frame = GetFrame( frame_index );

    char device_str[ 16 ];
    if( frame.mFlags & TX_HOST_TO_DEVICE )
    {
        sprintf( device_str, "Host" );

        char num_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

        char cmd_str[ 64 ];
        GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

        char result_str[ 255 ];

        sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );
        AddTabularText( result_str );
    }
    else
    {
        if( mSettings->mDeviceType == 0 )
        {
            sprintf( device_str, "Keyboard" );

            char num_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

            char tmp_str[ 128 ];
            char codetype[ 32 ];

            char key_str[ 64 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & ECHO_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ECHO" );

                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & ERROR_FRAME )
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "ERROR" );
                sprintf( key_str, "INVALID CODE" );
            }
            else if( frame.mFlags & PAUSE_BREAK )
            {
                sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                sprintf( codetype, "" );
                sprintf( key_str, "[PAUSE/BREAK]" );
            }
            else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                sprintf( codetype, "BREAK" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & PRINT_SCREEN )
            {
                sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                sprintf( codetype, "MAKE" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else if( frame.mFlags & EXTENDED_KEY )
            {
                sprintf( tmp_str, "0xE0, %s", num_str );
                sprintf( codetype, "MAKE" );
            }
            else if( frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MAKE" );
            }

            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];

            // at next zoom show originator and raw hex
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
        else
        {
            sprintf( device_str, "Mouse" );

            char num_str[ 128 ];

            char tmp_str[ 256 ];
            char codetype[ 32 ];

            char key_str[ 512 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & MOVEMENT_FRAME )
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MOVEMENT" );

                U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                U8 LeftButton = frame.mData1 & 0x01;

                U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                if( mSettings->mDeviceType == 1 )
                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "deltaX: %d, deltaY: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement, Ymovement );
                else
                {
                    U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                    U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                    U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton, FifthButton,
                             Xmovement, Ymovement, Zmovement );
                }
            }
            else
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "DATA" );

                sprintf( key_str, "" );
            }
            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
    }
}